

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_function_createClosureWithCaptureEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t functionDefinition,
          sysbvm_tuple_t captureEnviroment)

{
  _Bool _Var1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t type;
  
  _Var1 = sysbvm_tuple_isKindOf(context,functionDefinition,(context->roots).functionDefinitionType);
  if (!_Var1) {
    sysbvm_error("An actual function definition is required here.");
  }
  type = *(sysbvm_tuple_t *)(functionDefinition + 0x48);
  if (type == 0) {
    type = (context->roots).functionType;
  }
  psVar2 = sysbvm_context_allocatePointerTuple(context,type,0xc);
  psVar2[1].field_1 =
       *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(functionDefinition + 0x28);
  psVar2[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(functionDefinition + 0x38);
  psVar2[2].field_1.pointers[0] = captureEnviroment;
  psVar2[3].header.field_0.typePointer = functionDefinition;
  psVar2[3].header.identityHashAndFlags = 9;
  psVar2[3].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_function_createClosureWithCaptureEnvironment(sysbvm_context_t *context, sysbvm_tuple_t functionDefinition, sysbvm_tuple_t captureEnviroment)
{
    if(!sysbvm_tuple_isKindOf(context, functionDefinition, context->roots.functionDefinitionType))
        sysbvm_error("An actual function definition is required here.");

    sysbvm_functionDefinition_t *functionDefinitionObject = (sysbvm_functionDefinition_t*)functionDefinition;
    sysbvm_tuple_t functionType = functionDefinitionObject->type ? functionDefinitionObject->type : context->roots.functionType;

    sysbvm_function_t *result = (sysbvm_function_t*)sysbvm_context_allocatePointerTuple(context, functionType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_function_t));
    result->flags = functionDefinitionObject->flags;
    result->argumentCount = functionDefinitionObject->argumentCount; 
    result->captureEnvironment = captureEnviroment;
    result->definition = functionDefinition;
    result->primitiveTableIndex = sysbvm_tuple_uint32_encode(context, 0);
    return (sysbvm_tuple_t)result;
}